

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_1UL>::get
          (SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_1UL> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.isSet == true) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      pcVar2 = output[1].exception.ptr.field_1.value.ownFile.content.ptr;
      if (pcVar2 != (char *)0x0) {
        sVar3 = output[1].exception.ptr.field_1.value.ownFile.content.size_;
        output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        output[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
        pAVar4 = output[1].exception.ptr.field_1.value.ownFile.content.disposer;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
      }
    }
    output[1].exception.ptr.field_1.value.ownFile.content.ptr =
         (char *)pEVar1[1].exception.ptr.field_1.value.ownFile.content.size_;
    output[1].exception.ptr.field_1.value.ownFile.content.size_ =
         (size_t)pEVar1[1].exception.ptr.field_1.value.ownFile.content.disposer;
    output[1].exception.ptr.field_1.value.ownFile.content.disposer =
         (ArrayDisposer *)pEVar1[1].exception.ptr.field_1.value.file;
    pEVar1[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
    pEVar1[1].exception.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
    output[1].exception.ptr.isSet = true;
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
    pcVar2 = output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    if (pcVar2 != (char *)0x0) {
      sVar3 = output[1].exception.ptr.field_1.value.ownFile.content.size_;
      output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      output[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
      pAVar4 = output[1].exception.ptr.field_1.value.ownFile.content.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
    }
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }